

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeZ.cpp
# Opt level: O1

void __thiscall OpenMD::ChargeZ::process(ChargeZ *this)

{
  undefined8 *puVar1;
  vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *this_00;
  char cVar2;
  SimInfo *info;
  Snapshot *pSVar3;
  pointer pvVar4;
  long lVar5;
  iterator iVar6;
  iterator __position;
  pointer pdVar7;
  StuntDouble *pSVar8;
  AtomType *pAVar9;
  RealType RVar10;
  double dVar11;
  SelectionManager *this_01;
  bool bVar12;
  int iVar13;
  SelectionSet *pSVar14;
  pointer ppSVar15;
  uint i;
  ulong uVar16;
  double *__args;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  int ii;
  RealType area;
  Vector3d pos;
  StuntDouble *sd;
  FluctuatingChargeAdapter fqa;
  Mat3x3d hmat;
  DumpReader reader;
  int local_1344;
  double local_1340;
  SelectionSet local_1338;
  double local_1320;
  StuntDouble *local_1318;
  int local_130c;
  double local_1308;
  vector<double,std::allocator<double>> *local_1300;
  vector<double,std::allocator<double>> *local_12f8;
  SelectionEvaluator *local_12f0;
  SelectionManager *local_12e8;
  ulong local_12e0;
  FluctuatingChargeAdapter local_12d8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar2 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar13 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar13 / (this->super_StaticAnalyser).step_;
  if (0 < iVar13) {
    local_12f8 = (vector<double,std::allocator<double>> *)&this->zBox_;
    local_1300 = (vector<double,std::allocator<double>> *)&this->areas_;
    local_12f0 = &this->evaluator_;
    local_12e8 = &this->seleMan_;
    uVar20 = 0;
    local_130c = iVar13;
    do {
      this_01 = local_12e8;
      DumpReader::readFrame(&local_1288,(int)uVar20);
      pSVar3 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      this->currentSnapshot_ = pSVar3;
      uVar16 = (ulong)(this->super_StaticAnalyser).nBins_;
      if (uVar16 != 0) {
        pvVar4 = (this->sliceSDLists_).
                 super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar17 = 0;
        do {
          lVar5 = *(long *)((long)&(pvVar4->
                                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar17);
          if (*(long *)((long)&(pvVar4->
                               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar17) != lVar5) {
            *(long *)((long)&(pvVar4->
                             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish + lVar17) = lVar5;
          }
          lVar17 = lVar17 + 0x18;
        } while (uVar16 * 0x18 != lVar17);
      }
      Snapshot::getHmat(&local_12d0,pSVar3);
      __args = (double *)
               ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)(uint)this->axis_ * 0x20);
      iVar6._M_current =
           (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_12f8,iVar6,__args);
      }
      else {
        *iVar6._M_current = *__args;
        (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      uVar18 = this->axis_;
      local_1320 = *(double *)
                    ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                           .data_ + (ulong)uVar18 * 0x20) * 0.5;
      local_1340 = 0.0;
      pSVar3 = this->currentSnapshot_;
      if ((ulong)uVar18 == 0) {
        RVar10 = Snapshot::getYZarea(pSVar3);
        uVar21 = SUB84(RVar10,0);
        uVar22 = (undefined4)((ulong)RVar10 >> 0x20);
      }
      else if (uVar18 == 1) {
        RVar10 = Snapshot::getXZarea(pSVar3);
        uVar21 = SUB84(RVar10,0);
        uVar22 = (undefined4)((ulong)RVar10 >> 0x20);
      }
      else {
        RVar10 = Snapshot::getXYarea(pSVar3);
        uVar21 = SUB84(RVar10,0);
        uVar22 = (undefined4)((ulong)RVar10 >> 0x20);
      }
      local_1340 = (double)CONCAT44(uVar22,uVar21);
      iVar6._M_current =
           (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_1300,iVar6,&local_1340);
      }
      else {
        *iVar6._M_current = local_1340;
        (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1338,local_12f0);
        lVar17 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar17),(vector<bool,_std::allocator<bool>_> *)
                             ((long)&((local_1338.bitsets_.
                                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + lVar17));
          lVar17 = lVar17 + 0x28;
        } while (lVar17 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1338.bitsets_);
      }
      local_1318 = SelectionManager::beginSelected(this_01,&local_1344);
      while (local_1318 != (StuntDouble *)0x0) {
        pSVar14 = (SelectionSet *)
                  ((long)local_1318->localIndex_ * 0x18 +
                  *(long *)((long)&(local_1318->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_1318->storage_)
                  );
        local_1338.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1338.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1338.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pSVar14 != &local_1338) {
          lVar17 = 0;
          do {
            (&local_1338.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar17] =
                 (&(pSVar14->bitsets_).
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
        }
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1338);
        }
        pSVar14 = (SelectionSet *)
                  ((long)local_1318->localIndex_ * 0x18 +
                  *(long *)((long)&(local_1318->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_1318->storage_)
                  );
        if (pSVar14 != &local_1338) {
          lVar17 = 0;
          do {
            (&(pSVar14->bitsets_).
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar17] =
                 (&local_1338.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
        }
        local_1318 = SelectionManager::nextSelected(this_01,&local_1344);
      }
      local_1318 = SelectionManager::beginSelected(this_01,&local_1344);
      while (local_1318 != (StuntDouble *)0x0) {
        lVar17 = *(long *)((long)&(local_1318->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_1318->storage_);
        local_1338.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)(lVar17 + 0x10 + (long)local_1318->localIndex_ * 0x18);
        puVar1 = (undefined8 *)(lVar17 + (long)local_1318->localIndex_ * 0x18);
        local_1338.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*puVar1;
        local_1338.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)puVar1[1];
        iVar13 = (int)((((double)(&local_1338.bitsets_.
                                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                   ._M_impl.super__Vector_impl_data._M_start)[(uint)this->axis_] +
                        local_1320) * (double)(this->super_StaticAnalyser).nBins_) /
                      *(double *)
                       ((long)local_12d0.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_ +
                       (ulong)(uint)this->axis_ * 0x20));
        this_00 = (vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)
                  ((this->sliceSDLists_).
                   super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar13);
        __position._M_current = *(StuntDouble ***)(this_00 + 8);
        if (__position._M_current == *(StuntDouble ***)(this_00 + 0x10)) {
          std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
          _M_realloc_insert<OpenMD::StuntDouble*const&>(this_00,__position,&local_1318);
        }
        else {
          *__position._M_current = local_1318;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        pdVar7 = (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7[iVar13] = pdVar7[iVar13] + 1.0;
        local_1318 = SelectionManager::nextSelected(this_01,&local_1344);
      }
      local_12e0 = uVar20;
      if ((this->super_StaticAnalyser).nBins_ != 0) {
        uVar20 = 0;
        do {
          pvVar4 = (this->sliceSDLists_).
                   super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppSVar15 = pvVar4[uVar20].
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (pvVar4[uVar20].
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish == ppSVar15) {
            dVar11 = 0.0;
          }
          else {
            dVar11 = 0.0;
            uVar16 = 0;
            uVar19 = 1;
            do {
              pSVar8 = ppSVar15[uVar16];
              dVar23 = 0.0;
              if (pSVar8->objType_ < otRigidBody) {
                pAVar9 = (AtomType *)pSVar8[1]._vptr_StuntDouble;
                local_1338.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)pAVar9;
                local_1320 = dVar11;
                bVar12 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)&local_1338);
                dVar11 = 0.0;
                if (bVar12) {
                  RVar10 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)&local_1338);
                  dVar11 = RVar10 + 0.0;
                }
                local_1308 = dVar11;
                local_12d8.at_ = pAVar9;
                bVar12 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_12d8);
                dVar23 = local_1308;
                dVar11 = local_1320;
                if (bVar12) {
                  dVar23 = local_1308 +
                           *(double *)
                            (*(long *)((long)&(pSVar8->snapshotMan_->currentSnapshot_->atomData).
                                              flucQPos.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                      pSVar8->storage_) + (long)pSVar8->localIndex_ * 8);
                }
              }
              dVar11 = dVar11 + dVar23;
              pvVar4 = (this->sliceSDLists_).
                       super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppSVar15 = pvVar4[uVar20].
                         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              bVar12 = uVar19 < (ulong)((long)pvVar4[uVar20].
                                              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppSVar15 >> 3);
              uVar16 = uVar19;
              uVar19 = (ulong)((int)uVar19 + 1);
            } while (bVar12);
          }
          pdVar7 = (this->chargeZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7[uVar20] = dVar11 + pdVar7[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar20 < (this->super_StaticAnalyser).nBins_);
      }
      uVar18 = (int)local_12e0 + (this->super_StaticAnalyser).step_;
      uVar20 = (ulong)uVar18;
    } while ((int)uVar18 < local_130c);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void ChargeZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      Mat3x3d hmat = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;
      RealType area      = 0.0;
      switch (axis_) {
      case 0:
        area = currentSnapshot_->getYZarea();
        break;
      case 1:
        area = currentSnapshot_->getXZarea();
        break;
      case 2:
      default:
        area = currentSnapshot_->getXYarea();
        break;
      }

      areas_.push_back(area);

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
        sliceSDLists_[binNo].push_back(sd);
        sliceSDCount_[binNo]++;
      }

      // loop over the slices to calculate the charge
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType binC = 0;
        for (unsigned int k = 0; k < sliceSDLists_[i].size(); ++k) {
          RealType q = 0.0;
          Atom* atom = static_cast<Atom*>(sliceSDLists_[i][k]);

          AtomType* atomType = atom->getAtomType();

          if (sliceSDLists_[i][k]->isAtom()) {
            FixedChargeAdapter fca = FixedChargeAdapter(atomType);
            if (fca.isFixedCharge()) { q += fca.getCharge(); }

            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }
          }

          binC += q;
        }
        chargeZ_[i] += binC;
        // Units of (e / Ang^2 / fs)
      }
    }

    writeChargeZ();
  }